

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_color
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,Vec4f *_color
          )

{
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_00;
  return_type rVar1;
  Color local_1c;
  
  this_00 = (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
            this->mesh_;
  if ((this_00->vertex_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.
      super_BaseHandle.idx_ != -1) {
    rVar1 = color_caster<OpenMesh::VectorT<unsigned_char,_3>,_OpenMesh::VectorT<float,_4>_>::cast
                      (_color);
    local_1c.super_VectorDataT<unsigned_char,_3>.values_._0_2_ =
         rVar1.super_VectorDataT<unsigned_char,_3>.values_._0_2_;
    local_1c.super_VectorDataT<unsigned_char,_3>.values_[2] =
         rVar1.super_VectorDataT<unsigned_char,_3>.values_[2];
    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::set_color
              (this_00,_vh,&local_1c);
  }
  return;
}

Assistant:

virtual void set_color(VertexHandle _vh, const Vec4f& _color)
  {
    if (mesh_.has_vertex_colors())
      mesh_.set_color(_vh, color_cast<Color>(_color));
  }